

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
socketsys::SocketBindException::SocketBindException
          (SocketBindException *this,char *message,int error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,error);
  std::operator+(&bStack_58,message,&local_38);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__runtime_error_00144ca0;
  return;
}

Assistant:

explicit SocketBindException(const char* message, int error) : std::runtime_error(message + std::to_string(error)) {}